

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.h
# Opt level: O2

void __thiscall
SkipList<int,_int>::SkipList(SkipList<int,_int> *this,ion_dictionary_config_info_t config)

{
  int __oflag;
  char *in_RSI;
  
  sldict_init((ion_dictionary_handler_t *)this);
  Dictionary<int,_int>::open(&this->super_Dictionary<int,_int>,in_RSI,__oflag);
  return;
}

Assistant:

SkipList(
	ion_dictionary_config_info_t config
) {
	sldict_init(&this->handler);

	this->open(config);
}